

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O0

void __thiscall
BailOutInfo::IterateArgOutSyms<BackwardPass::ProcessBailOutInfo(IR::Instr*,BailOutInfo*)::__0>
          (BailOutInfo *this,anon_class_8_1_cdd3212f callback)

{
  StackSym *this_00;
  ArgSlot AVar1;
  uint uVar2;
  StackSym *sym;
  uint j;
  uint outParamCount;
  uint i;
  uint argOutIndex;
  BailOutInfo *this_local;
  anon_class_8_1_cdd3212f callback_local;
  
  outParamCount = 0;
  this_local = (BailOutInfo *)callback.bailoutReferencedArgSymsBv;
  for (j = 0; j < this->startCallCount; j = j + 1) {
    uVar2 = GetStartCallOutParamCount(this,j);
    for (sym._0_4_ = 0; (uint)sym < uVar2; sym._0_4_ = (uint)sym + 1) {
      this_00 = this->argOutSyms[outParamCount];
      if (this_00 != (StackSym *)0x0) {
        AVar1 = StackSym::GetArgSlotNum(this_00);
        BackwardPass::ProcessBailOutInfo::anon_class_8_1_cdd3212f::operator()
                  ((anon_class_8_1_cdd3212f *)&this_local,outParamCount,j + AVar1,this_00);
      }
      outParamCount = outParamCount + 1;
    }
  }
  return;
}

Assistant:

void IterateArgOutSyms(Fn callback)
    {
        uint argOutIndex = 0;
        for(uint i = 0; i < this->startCallCount; i++)
        {
            uint outParamCount = this->GetStartCallOutParamCount(i);
            for(uint j = 0; j < outParamCount; j++)
            {
                StackSym* sym = this->argOutSyms[argOutIndex];
                if(sym)
                {
                    callback(argOutIndex, i + sym->GetArgSlotNum(), sym);
                }
                argOutIndex++;
            }
        }
    }